

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O2

void load_kde_mimelnk(char *filename,char *icondir)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  Fl_File_Icon *this;
  size_t sVar3;
  char *pcVar4;
  size_t size;
  long lVar5;
  char mimetype [1024];
  char pattern [1024];
  char iconfilename [2048];
  char full_iconfilename [2048];
  char tmp [1024];
  
  mimetype[0] = '\0';
  pattern[0] = '\0';
  iconfilename[0] = '\0';
  __stream = (FILE *)fl_fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  while (pcVar2 = fgets(tmp,0x400,__stream), pcVar2 != (char *)0x0) {
    pcVar2 = get_kde_val(tmp,"Icon");
    if (pcVar2 != (char *)0x0) {
      size = 0x800;
      pcVar4 = iconfilename;
      goto LAB_002044c9;
    }
    pcVar2 = get_kde_val(tmp,"MimeType");
    if (pcVar2 != (char *)0x0) {
      size = 0x400;
      pcVar4 = mimetype;
      goto LAB_002044c9;
    }
    pcVar2 = get_kde_val(tmp,"Patterns");
    if (pcVar2 != (char *)0x0) {
      size = 0x400;
      pcVar4 = pattern;
LAB_002044c9:
      fl_strlcpy(pcVar4,pcVar2,size);
    }
  }
  fclose(__stream);
  if ((pattern[0] == '\0') && (iVar1 = bcmp(mimetype,"inode/",6), iVar1 != 0)) {
    return;
  }
  if (iconfilename[0] == '\0') {
    return;
  }
  if (iconfilename[0] == '/') {
    fl_strlcpy(full_iconfilename,iconfilename,0x800);
  }
  else {
    iVar1 = access(icondir,0);
    if (iVar1 == 0) {
      lVar5 = 0;
      do {
        if (lVar5 == 0x28) {
          return;
        }
        snprintf(full_iconfilename,0x800,"%s/%s/%s.png",icondir,
                 (long)&_ZZL16load_kde_mimelnkPKcS0_E5paths_rel +
                 (long)*(int *)((long)&_ZZL16load_kde_mimelnkPKcS0_E5paths_rel + lVar5),iconfilename
                );
        iVar1 = access(full_iconfilename,0);
        lVar5 = lVar5 + 4;
      } while (iVar1 != 0);
    }
    else {
      snprintf(full_iconfilename,0x800,"%s/%s");
      iVar1 = access(full_iconfilename,0);
      if (iVar1 != 0) {
        return;
      }
    }
  }
  iVar1 = bcmp(mimetype,"inode/",6);
  if (iVar1 != 0) {
    this = (Fl_File_Icon *)operator_new(0x28);
    sVar3 = strlen(pattern);
    pcVar2 = (char *)malloc(sVar3 + 3);
    pcVar2[0] = '{';
    pcVar2[1] = '\0';
    strcpy(pcVar2 + 1,pattern);
    sVar3 = strlen(pcVar2);
    if (pcVar2[sVar3 - 1] == ';') {
      pcVar2[sVar3 - 1] = '\0';
    }
    sVar3 = strlen(pcVar2);
    (pcVar2 + sVar3)[0] = '}';
    (pcVar2 + sVar3)[1] = '\0';
    pcVar4 = pcVar2;
    do {
      if (*pcVar4 == ';') {
        *pcVar4 = '|';
      }
      else if (*pcVar4 == '\0') goto LAB_00204623;
      pcVar4 = pcVar4 + 1;
    } while( true );
  }
  pcVar2 = mimetype + 6;
  iVar1 = bcmp(pcVar2,"directory",10);
  if (iVar1 == 0) {
    this = (Fl_File_Icon *)operator_new(0x28);
    Fl_File_Icon::Fl_File_Icon(this,"*",5,0,(short *)0x0);
  }
  else {
    iVar1 = bcmp(pcVar2,"blockdevice",0xc);
    if (iVar1 == 0) {
      this = (Fl_File_Icon *)operator_new(0x28);
      Fl_File_Icon::Fl_File_Icon(this,"*",3,0,(short *)0x0);
    }
    else {
      iVar1 = bcmp(pcVar2,"fifo",5);
      if (iVar1 != 0) {
        return;
      }
      this = (Fl_File_Icon *)operator_new(0x28);
      Fl_File_Icon::Fl_File_Icon(this,"*",2,0,(short *)0x0);
    }
  }
LAB_00204636:
  Fl_File_Icon::load(this,full_iconfilename);
  return;
LAB_00204623:
  Fl_File_Icon::Fl_File_Icon(this,pcVar2,1,0,(short *)0x0);
  goto LAB_00204636;
}

Assistant:

static void
load_kde_mimelnk(const char *filename,	// I - mimelnk filename
                 const char *icondir) {	// I - Location of icons
  FILE		*fp;
  char		tmp[1024];
  char		iconfilename[FL_PATH_MAX];
  char		pattern[1024];
  char		mimetype[1024];
  char		*val;
  char		full_iconfilename[FL_PATH_MAX];
  Fl_File_Icon	*icon;


  mimetype[0]     = '\0';
  pattern[0]      = '\0';
  iconfilename[0] = '\0';

  if ((fp = fl_fopen(filename, "rb")) != NULL) {
    while (fgets(tmp, sizeof(tmp), fp)) {
      if ((val = get_kde_val(tmp, "Icon")) != NULL)
	strlcpy(iconfilename, val, sizeof(iconfilename));
      else if ((val = get_kde_val(tmp, "MimeType")) != NULL)
	strlcpy(mimetype, val, sizeof(mimetype));
      else if ((val = get_kde_val(tmp, "Patterns")) != NULL)
	strlcpy(pattern, val, sizeof(pattern));
    }

    fclose(fp);

#ifdef DEBUG
    printf("%s: Icon=\"%s\", MimeType=\"%s\", Patterns=\"%s\"\n", filename,
           iconfilename, mimetype, pattern);
#endif // DEBUG

    if (!pattern[0] && strncmp(mimetype, "inode/", 6)) return;

    if (iconfilename[0]) {
      if (iconfilename[0] == '/') {
        strlcpy(full_iconfilename, iconfilename, sizeof(full_iconfilename));
      } else if (!access(icondir, F_OK)) {
        // KDE 3.x and 2.x icons
	int		i;		// Looping var
	static const char *paths[] = {	// Subdirs to look in...
	  "16x16/actions",
	  "16x16/apps",
	  "16x16/devices",
	  "16x16/filesystems",
	  "16x16/mimetypes",
/*
	  "20x20/actions",
	  "20x20/apps",
	  "20x20/devices",
	  "20x20/filesystems",
	  "20x20/mimetypes",

	  "22x22/actions",
	  "22x22/apps",
	  "22x22/devices",
	  "22x22/filesystems",
	  "22x22/mimetypes",

	  "24x24/actions",
	  "24x24/apps",
	  "24x24/devices",
	  "24x24/filesystems",
	  "24x24/mimetypes",
*/
	  "32x32/actions",
	  "32x32/apps",
	  "32x32/devices",
	  "32x32/filesystems",
	  "32x32/mimetypes",
/*
	  "36x36/actions",
	  "36x36/apps",
	  "36x36/devices",
	  "36x36/filesystems",
	  "36x36/mimetypes",

	  "48x48/actions",
	  "48x48/apps",
	  "48x48/devices",
	  "48x48/filesystems",
	  "48x48/mimetypes",

	  "64x64/actions",
	  "64x64/apps",
	  "64x64/devices",
	  "64x64/filesystems",
	  "64x64/mimetypes",

	  "96x96/actions",
	  "96x96/apps",
	  "96x96/devices",
	  "96x96/filesystems",
	  "96x96/mimetypes"
*/	};

        for (i = 0; i < (int)(sizeof(paths) / sizeof(paths[0])); i ++) {
          snprintf(full_iconfilename, sizeof(full_iconfilename),
	           "%s/%s/%s.png", icondir, paths[i], iconfilename);

          if (!access(full_iconfilename, F_OK)) break;
	}

        if (i >= (int)(sizeof(paths) / sizeof(paths[0]))) return;
      } else {
        // KDE 1.x icons
        snprintf(full_iconfilename, sizeof(full_iconfilename),
	         "%s/%s", tmp, iconfilename);

        if (access(full_iconfilename, F_OK)) return;
      }

      if (strncmp(mimetype, "inode/", 6) == 0) {
	if (!strcmp(mimetype + 6, "directory"))
	  icon = new Fl_File_Icon("*", Fl_File_Icon::DIRECTORY);
	else if (!strcmp(mimetype + 6, "blockdevice"))
	  icon = new Fl_File_Icon("*", Fl_File_Icon::DEVICE);
	else if (!strcmp(mimetype + 6, "fifo"))
	  icon = new Fl_File_Icon("*", Fl_File_Icon::FIFO);
	else return;
      } else {
        icon = new Fl_File_Icon(kde_to_fltk_pattern(pattern),
                                Fl_File_Icon::PLAIN);
      }

      icon->load(full_iconfilename);
    }
  }
}